

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void __thiscall EDLines::JoinCollinearLines(EDLines *this)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  LineSegment *ls2;
  ulong uVar7;
  pointer pLVar8;
  pointer pLVar9;
  double *pdVar10;
  int iVar11;
  int changeIndex;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  byte bVar17;
  
  bVar17 = 0;
  iVar4 = this->linesNo;
  if (iVar4 < 1) {
    iVar11 = 0;
  }
  else {
    uVar15 = 0;
    iVar11 = -1;
    do {
      iVar13 = (int)uVar15;
      pLVar9 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = pLVar9[uVar15].segmentNo;
      iVar11 = iVar11 + 1;
      if (iVar11 != iVar13) {
        pLVar9[iVar11].len = pLVar9[uVar15].len;
        pLVar8 = pLVar9 + uVar15;
        pLVar9 = pLVar9 + iVar11;
        for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
          pLVar9->a = pLVar8->a;
          pLVar8 = (pointer)((long)pLVar8 + ((ulong)bVar17 * -2 + 1) * 8);
          pLVar9 = (pointer)((long)pLVar9 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        iVar4 = this->linesNo;
      }
      iVar16 = 1;
      if ((int)(iVar13 + 1U) < iVar4) {
        uVar7 = (ulong)(iVar13 + 1U);
        pLVar9 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl
                 .super__Vector_impl_data._M_start;
        iVar16 = 1;
        iVar12 = iVar11;
        if (pLVar9[uVar7].segmentNo == iVar2) {
          ls2 = pLVar9 + uVar7;
          lVar5 = uVar7 * 0x48;
          changeIndex = iVar11;
          iVar14 = -2;
          do {
            iVar16 = iVar14;
            bVar3 = TryToJoinTwoLineSegments(this,pLVar9 + changeIndex,ls2,changeIndex);
            iVar14 = (int)uVar15;
            iVar12 = changeIndex;
            if ((!bVar3) && (iVar12 = changeIndex + 1, iVar14 != changeIndex)) {
              pLVar9 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pLVar9[iVar12].len = *(int *)((long)&pLVar9->len + lVar5);
              pdVar10 = (double *)((long)&pLVar9->a + lVar5);
              pLVar9 = pLVar9 + iVar12;
              for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
                pLVar9->a = *pdVar10;
                pdVar10 = pdVar10 + (ulong)bVar17 * -2 + 1;
                pLVar9 = (pointer)((long)pLVar9 + ((ulong)bVar17 * -2 + 1) * 8);
              }
            }
            iVar4 = this->linesNo;
            if (iVar4 <= iVar14 + 2) break;
            uVar7 = uVar7 + 1;
            pLVar9 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            ls2 = pLVar9 + uVar7;
            uVar15 = (ulong)(iVar14 + 1);
            piVar1 = (int *)((long)&pLVar9[1].segmentNo + lVar5);
            lVar5 = lVar5 + 0x48;
            changeIndex = iVar12;
            iVar14 = iVar16 + -1;
          } while (*piVar1 == iVar2);
          iVar16 = -iVar16;
        }
        if (iVar11 != iVar12) {
          pLVar9 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar3 = TryToJoinTwoLineSegments(this,pLVar9 + iVar11,pLVar9 + iVar12,iVar11);
          iVar11 = iVar12 - (uint)bVar3;
          iVar4 = this->linesNo;
        }
      }
      uVar15 = (ulong)(uint)(iVar13 + iVar16);
    } while (iVar13 + iVar16 < iVar4);
    iVar11 = iVar11 + 1;
  }
  this->linesNo = iVar11;
  return;
}

Assistant:

void EDLines::JoinCollinearLines()
{
	int lastLineIndex = -1;   //Index of the last line in the joined lines
	int i = 0;
	while (i < linesNo) {
		int segmentNo = lines[i].segmentNo;

		lastLineIndex++;
		if (lastLineIndex != i) 
			lines[lastLineIndex] = lines[i];
		
		int firstLineIndex = lastLineIndex;  // Index of the first line in this segment

		int count = 1;
		for (int j = i + 1; j< linesNo; j++) {
			if (lines[j].segmentNo != segmentNo) break;

			// Try to combine this line with the previous line in this segment
			if (TryToJoinTwoLineSegments(&lines[lastLineIndex], &lines[j],
				lastLineIndex) == false) {
				lastLineIndex++;
				if (lastLineIndex != j) 
					lines[lastLineIndex] = lines[j];
				
			} //end-if

			count++;
		} //end-for

		  // Try to join the first & last line of this segment
		if (firstLineIndex != lastLineIndex) {
			if (TryToJoinTwoLineSegments(&lines[firstLineIndex], &lines[lastLineIndex],
				firstLineIndex)) {
				lastLineIndex--;
			} //end-if
		} //end-if

		i += count;
	} //end-while

	linesNo = lastLineIndex + 1;
}